

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O2

char * ps_astar_hyp(ps_astar_t *nbest,ps_latpath_t *path)

{
  ps_search_t *ppVar1;
  char *__s;
  int iVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  glist_t pgVar6;
  size_t elem_size;
  char *__dest;
  ps_latpath_s *ppVar7;
  
  ppVar1 = nbest->dag->search;
  elem_size = 0;
  for (ppVar7 = path; ppVar7 != (ps_latpath_t *)0x0; ppVar7 = ppVar7->parent) {
    iVar2 = dict_real_word(ppVar1->dict,ppVar7->node->basewid);
    if (((iVar2 != 0) && (lVar3 = (long)ppVar7->node->basewid, -1 < lVar3)) &&
       (pcVar5 = ppVar1->dict->word[lVar3].word, pcVar5 != (char *)0x0)) {
      sVar4 = strlen(pcVar5);
      elem_size = elem_size + sVar4 + 1;
    }
  }
  if (elem_size == 0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = (char *)__ckd_calloc__(1,elem_size,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                    ,0x727);
    __dest = pcVar5 + (elem_size - 1);
    for (; path != (ps_latpath_t *)0x0; path = path->parent) {
      iVar2 = dict_real_word(ppVar1->dict,path->node->basewid);
      if (((iVar2 != 0) && (lVar3 = (long)path->node->basewid, -1 < lVar3)) &&
         (__s = ppVar1->dict->word[lVar3].word, __s != (char *)0x0)) {
        sVar4 = strlen(__s);
        __dest = __dest + -sVar4;
        memcpy(__dest,__s,sVar4);
        if (pcVar5 < __dest) {
          __dest[-1] = ' ';
          __dest = __dest + -1;
        }
      }
    }
    pgVar6 = glist_add_ptr(nbest->hyps,pcVar5);
    nbest->hyps = pgVar6;
  }
  return pcVar5;
}

Assistant:

char const *
ps_astar_hyp(ps_astar_t *nbest, ps_latpath_t *path)
{
    ps_search_t *search;
    ps_latpath_t *p;
    size_t len;
    char *c;
    char *hyp;

    search = nbest->dag->search;

    /* Backtrace once to get hypothesis length. */
    len = 0;
    for (p = path; p; p = p->parent) {
        if (dict_real_word(ps_search_dict(search), p->node->basewid)) {
    	    char *wstr = dict_wordstr(ps_search_dict(search), p->node->basewid);
    	    if (wstr != NULL)
    	        len += strlen(wstr) + 1;
        }
    }

    if (len == 0) {
	return NULL;
    }

    /* Backtrace again to construct hypothesis string. */
    hyp = ckd_calloc(1, len);
    c = hyp + len - 1;
    for (p = path; p; p = p->parent) {
        if (dict_real_word(ps_search_dict(search), p->node->basewid)) {
    	    char *wstr = dict_wordstr(ps_search_dict(search), p->node->basewid);
    	    if (wstr != NULL) {
	        len = strlen(wstr);
    		c -= len;
        	memcpy(c, wstr, len);
    		if (c > hyp) {
            	    --c;
        	    *c = ' ';
    		}
    	    }
        }
    }

    nbest->hyps = glist_add_ptr(nbest->hyps, hyp);
    return hyp;
}